

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_rand.c
# Opt level: O0

ares_bool_t ares_init_rand_engine(ares_rand_state *state)

{
  FILE *pFVar1;
  ares_rand_state *state_local;
  
  state->cache_remaining = 0;
  if ((state->bad_backends & ARES_RAND_OS) == 0) {
    state->type = ARES_RAND_OS;
  }
  else {
    if ((state->bad_backends & ARES_RAND_FILE) == 0) {
      state->type = ARES_RAND_FILE;
      pFVar1 = fopen("/dev/urandom","rb");
      (state->state).rand_file = (FILE *)pFVar1;
      if ((state->state).rand_file != (FILE *)0x0) {
        setvbuf((FILE *)(state->state).rand_file,(char *)0x0,2,0);
        return ARES_TRUE;
      }
    }
    state->type = ARES_RAND_RC4;
    ares_rc4_init(&(state->state).rc4);
  }
  return ARES_TRUE;
}

Assistant:

static ares_bool_t ares_init_rand_engine(ares_rand_state *state)
{
  state->cache_remaining = 0;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* For fuzzing, random should be deterministic */
  state->bad_backends |= ARES_RAND_OS | ARES_RAND_FILE;
#endif

#if defined(HAVE_ARC4RANDOM_BUF) || defined(HAVE_GETRANDOM) || defined(_WIN32)
  if (!(state->bad_backends & ARES_RAND_OS)) {
    state->type = ARES_RAND_OS;
    return ARES_TRUE;
  }
#endif

#if defined(CARES_RANDOM_FILE)
  /* LCOV_EXCL_START: FallbackCode */
  if (!(state->bad_backends & ARES_RAND_FILE)) {
    state->type            = ARES_RAND_FILE;
    state->state.rand_file = fopen(CARES_RANDOM_FILE, "rb");
    if (state->state.rand_file) {
      setvbuf(state->state.rand_file, NULL, _IONBF, 0);
      return ARES_TRUE;
    }
  }
  /* LCOV_EXCL_STOP */

  /* Fall-Thru on failure to RC4 */
#endif

  /* LCOV_EXCL_START: FallbackCode */
  state->type = ARES_RAND_RC4;
  ares_rc4_init(&state->state.rc4);
  /* LCOV_EXCL_STOP */

  /* Currently cannot fail */
  return ARES_TRUE; /* LCOV_EXCL_LINE: UntestablePath */
}